

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

void __thiscall
gl4cts::GLSL420Pack::QualifierOverrideLayoutTest::prepareVertexBuffer
          (QualifierOverrideLayoutTest *this,program *program,buffer *buffer,vertexArray *vao)

{
  GLint GVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *this_00;
  socklen_t __len;
  sockaddr *__addr;
  _Alloc_hider _Var5;
  GLchar *in_R8;
  string test_name;
  GLfloat data [4];
  string local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  long lVar4;
  
  __len = 0x1be63f5;
  Utils::getVariableName_abi_cxx11_(&local_58,(Utils *)&DAT_00000001,COMPUTE_SHADER,0x1be63f5,in_R8)
  ;
  _Var5._M_p = local_58._M_dataplus._M_p;
  GVar1 = Utils::program::getAttribLocation(program,local_58._M_dataplus._M_p);
  iVar2 = (int)_Var5._M_p;
  if (GVar1 == 2) {
    Utils::vertexArray::generate(vao);
    Utils::vertexArray::bind(vao,iVar2,__addr,__len);
    Utils::buffer::generate(buffer,0x8892);
    local_38 = 0x3f80000000000000;
    uStack_30 = 0x3f80000000000000;
    Utils::buffer::update(buffer,0x10,&local_38,0x88e4);
    iVar2 = (*((this->super_GLSLTestBase).super_TestBase.super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    lVar4 = CONCAT44(extraout_var,iVar2);
    (**(code **)(lVar4 + 0x19f0))(2,4,0x1406,0,0,0);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"VertexAttribPointer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x1f02);
    (**(code **)(lVar4 + 0x610))(2);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"EnableVertexAttribArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x1f06);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Vertex attribute location is invalid",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
             ,0x1eef);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void QualifierOverrideLayoutTest::prepareVertexBuffer(const Utils::program& program, Utils::buffer& buffer,
													  Utils::vertexArray& vao)
{
	static const GLint expected_location = 2;

	std::string test_name = Utils::getVariableName(Utils::VERTEX_SHADER, Utils::INPUT, "test");
	GLint		test_loc  = program.getAttribLocation(test_name.c_str());

	if (expected_location != test_loc)
	{
		TCU_FAIL("Vertex attribute location is invalid");
	}

	vao.generate();
	vao.bind();

	buffer.generate(GL_ARRAY_BUFFER);

	GLfloat	data[]	= { 0.0f, 1.0f, 0.0f, 1.0f };
	GLsizeiptr data_size = sizeof(data);

	buffer.update(data_size, data, GL_STATIC_DRAW);

	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up vao */
	gl.vertexAttribPointer(test_loc, 4 /* size */, GL_FLOAT /* type */, GL_FALSE /* normalized*/, 0 /* stride */,
						   0 /* offset */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttribPointer");

	/* Enable attribute */
	gl.enableVertexAttribArray(test_loc);
	GLU_EXPECT_NO_ERROR(gl.getError(), "EnableVertexAttribArray");
}